

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O0

int list_delete_many(AD **list,_func_Boolean_AD_ptr_Pointer *pred,Pointer closure,
                    _func_void_AD_ptr *action)

{
  long lVar1;
  code *in_RCX;
  undefined8 in_RDX;
  code *in_RSI;
  long *in_RDI;
  int ndeleted;
  AD *ad2;
  AD *ad1;
  undefined4 local_34;
  undefined8 local_30;
  undefined8 local_28;
  
  local_34 = 0;
  local_30 = 0;
  for (local_28 = *in_RDI; local_28 != 0; local_28 = *(long *)(local_28 + 0x40)) {
    lVar1 = (*in_RSI)(local_28,in_RDX);
    if (lVar1 == 0) {
      local_30 = local_28;
    }
    else {
      if (in_RCX != (code *)0x0) {
        (*in_RCX)(local_28);
      }
      if (local_30 == 0) {
        *in_RDI = *(long *)(local_28 + 0x40);
      }
      else {
        *(undefined8 *)(local_30 + 0x40) = *(undefined8 *)(local_28 + 0x40);
      }
      local_34 = local_34 + 1;
    }
  }
  return local_34;
}

Assistant:

private int list_delete_many(list, pred, closure, action)
    AD        **list;        /* the list to search */
    Boolean    (*pred)(AD *, Pointer);    /* predicate */
    Pointer    closure;    /* for pred */
    void    (*action)(AD *);    /* to apply before deletion */
{
    AD        *ad1;        /* lead traversal pointer */
    AD        *ad2;        /* trailing traversal pointer */
    int        ndeleted = 0;    /* # of elements deleted from list */

    for (ad2 = (AD *)NULL, ad1 = *list; ad1; ad1 = ad1->next)
    {
        /* does ad1 match? */
        if ((*pred)(ad1, closure))
        {
            /* yes; apply action, then delete ad1 from list */
            if (action != (void (*)())NULL)
                (*action)(ad1);
            if (ad2)
            {
                /* ad1 is second or later element */
                ad2->next = ad1->next;
            }
            else
            {
                /* ad1 is first element */
                *list = ad1->next;
            }

            ndeleted++;
        }
        else
        {
            /* no; ad1 survives, so scoot ad2 along */
            ad2 = ad1;
        }
    }

    /* return the # of elements deleted from list */
    return ndeleted;
}